

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_basic_render
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  uint uVar1;
  ShaderProgram *pSVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LayoutBindingProgram *this_00;
  code *pcVar5;
  uint *puVar6;
  long *plVar7;
  _Alloc_hider _Var8;
  LayoutBindingTestResult *pLVar9;
  size_type *psVar10;
  LayoutBindingTestResult drawTestResult;
  allocator<char> local_322;
  allocator<char> local_321;
  String decl;
  String local_300;
  LayoutBindingTestResult *local_2e0;
  uint local_2d4;
  vector<int,_std::allocator<int>_> bindings;
  String local_2b8;
  long *local_298 [2];
  long local_288 [2];
  IProgramContextSupplier *local_278;
  uint *local_270;
  String local_268;
  String local_248;
  String local_228;
  String local_208;
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  StringStream s;
  undefined4 extraout_var_01;
  
  std::ios_base::ios_base
            ((ios_base *)
             &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
       glUniformMatrix3x2fv;
  s.super_ostringstream._328_8_ = 0;
  s.super_ostringstream._336_2_ = 0;
  s.super_ostringstream._344_8_ = 0;
  s.super_ostringstream._352_8_ = 0;
  s.super_ostringstream._360_8_ = 0;
  s.super_ostringstream._368_8_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&PTR__StringStream_020f2a68;
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
       &PTR__StringStream_020f2a90;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&decl,this,0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1b])
            (&drawTestResult,this,&decl);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&s,(char *)drawTestResult._0_8_,
                      (long)drawTestResult.m_reason._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n",2);
  psVar10 = &drawTestResult.m_reason._M_string_length;
  if ((size_type *)drawTestResult._0_8_ != psVar10) {
    operator_delete((void *)drawTestResult._0_8_,
                    CONCAT71(drawTestResult.m_reason._M_string_length._1_7_,
                             (undefined1)drawTestResult.m_reason._M_string_length) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)decl._M_dataplus._M_p != &decl.field_2) {
    operator_delete(decl._M_dataplus._M_p,decl.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  setTemplateParam(this,(this->m_stage).type,"UNIFORM_ACCESS",(String *)&drawTestResult);
  if ((size_type *)drawTestResult._0_8_ != psVar10) {
    operator_delete((void *)drawTestResult._0_8_,
                    CONCAT71(drawTestResult.m_reason._M_string_length._1_7_,
                             (undefined1)drawTestResult.m_reason._M_string_length) + 1);
  }
  local_2e0 = __return_storage_ptr__;
  iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])(this);
  makeSparseRange(&bindings,this,iVar3,0);
  if (bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start <
      bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_278 = &this->super_IProgramContextSupplier;
    puVar6 = (uint *)bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    do {
      uVar1 = *puVar6;
      local_270 = puVar6;
      iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&drawTestResult,*(char **)CONCAT44(extraout_var,iVar3),&local_321);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])
                (&local_300,this,(ulong)uVar1);
      iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,*(char **)(CONCAT44(extraout_var_00,iVar3) + 0x18),&local_322)
      ;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_1c8,this,0)
      ;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
                (&local_248,this,local_1c8);
      local_2d4 = uVar1;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_1e8,this,0)
      ;
      local_298[0] = local_288;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"float","");
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
                (&local_268,this,local_1e8,(string *)local_298);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                (&local_208,this,0);
      local_2b8._M_string_length = 0;
      local_2b8.field_2._M_local_buf[0] = '\0';
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      buildUniformDecl(&decl,this,(String *)&drawTestResult,&local_300,&local_228,&local_248,
                       &local_268,&local_208,&local_2b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,
                        CONCAT71(local_2b8.field_2._M_allocated_capacity._1_7_,
                                 local_2b8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      psVar10 = &drawTestResult.m_reason._M_string_length;
      if (local_298[0] != local_288) {
        operator_delete(local_298[0],local_288[0] + 1);
      }
      if (local_1e8[0] != local_1d8) {
        operator_delete(local_1e8[0],local_1d8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0],local_1b8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      if ((size_type *)drawTestResult._0_8_ != psVar10) {
        operator_delete((void *)drawTestResult._0_8_,
                        CONCAT71(drawTestResult.m_reason._M_string_length._1_7_,
                                 (undefined1)drawTestResult.m_reason._M_string_length) + 1);
      }
      setTemplateParam(this,(this->m_stage).type,"UNIFORM_DECL",&decl);
      updateTemplate(this,(this->m_stage).type);
      iVar3 = (*local_278->_vptr_IProgramContextSupplier[6])();
      this_00 = (LayoutBindingProgram *)CONCAT44(extraout_var_01,iVar3);
      iVar3 = (*this_00->_vptr_LayoutBindingProgram[2])(this_00);
      pSVar2 = this_00->m_program;
      if (iVar3 != 2) {
        if (((*pSVar2->m_shaders[1].
               super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
               super__Vector_impl_data._M_start)->m_info).compileOk != false) goto LAB_00bc19b2;
LAB_00bc1ab8:
        LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&drawTestResult,this_00,false);
        pLVar9 = local_2e0;
        local_2e0->m_passed = false;
        local_2e0->m_notRunForThisContext = false;
        (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0->m_reason,drawTestResult._0_8_,
                   drawTestResult.m_reason._M_dataplus._M_p + drawTestResult._0_8_);
        if ((size_type *)drawTestResult._0_8_ != psVar10) {
          drawTestResult.m_reason.field_2._M_allocated_capacity =
               CONCAT71(drawTestResult.m_reason._M_string_length._1_7_,
                        (undefined1)drawTestResult.m_reason._M_string_length);
          _Var8._M_p = (pointer)drawTestResult._0_8_;
LAB_00bc1b90:
          operator_delete(_Var8._M_p,drawTestResult.m_reason.field_2._M_allocated_capacity + 1);
        }
LAB_00bc1b98:
        (*this_00->_vptr_LayoutBindingProgram[1])(this_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)decl._M_dataplus._M_p != &decl.field_2) goto LAB_00bc1bb5;
        goto LAB_00bc1bbd;
      }
      if (((*pSVar2->m_shaders[5].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
             _M_impl.super__Vector_impl_data._M_start)->m_info).compileOk != true)
      goto LAB_00bc1ab8;
LAB_00bc19b2:
      if ((pSVar2->m_program).m_info.linkOk == false) goto LAB_00bc1ab8;
      pcVar5 = (code *)this->m_drawTest;
      plVar7 = (long *)((long)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode +
                       *(long *)&this->field_0x88);
      if (((ulong)pcVar5 & 1) != 0) {
        pcVar5 = *(code **)(pcVar5 + *plVar7 + -1);
      }
      (*pcVar5)(&drawTestResult,plVar7,(pSVar2->m_program).m_program,local_2d4);
      if (drawTestResult.m_passed == false) {
        local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_300,drawTestResult.m_reason._M_dataplus._M_p,
                   drawTestResult.m_reason._M_dataplus._M_p +
                   CONCAT71(drawTestResult.m_reason._M_string_length._1_7_,
                            (undefined1)drawTestResult.m_reason._M_string_length));
        pLVar9 = local_2e0;
        local_2e0->m_passed = false;
        local_2e0->m_notRunForThisContext = false;
        (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0->m_reason,local_300._M_dataplus._M_p,
                   local_300._M_dataplus._M_p + local_300._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
        }
        _Var8._M_p = drawTestResult.m_reason._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)drawTestResult.m_reason._M_dataplus._M_p != &drawTestResult.m_reason.field_2)
        goto LAB_00bc1b90;
        goto LAB_00bc1b98;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)drawTestResult.m_reason._M_dataplus._M_p != &drawTestResult.m_reason.field_2) {
        operator_delete(drawTestResult.m_reason._M_dataplus._M_p,
                        drawTestResult.m_reason.field_2._M_allocated_capacity + 1);
      }
      (*this_00->_vptr_LayoutBindingProgram[1])(this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)decl._M_dataplus._M_p != &decl.field_2) {
        operator_delete(decl._M_dataplus._M_p,decl.field_2._M_allocated_capacity + 1);
      }
      puVar6 = local_270 + 1;
    } while (puVar6 < bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  }
  pLVar9 = local_2e0;
  psVar10 = &drawTestResult.m_reason._M_string_length;
  drawTestResult.m_reason._M_dataplus._M_p = (pointer)0x0;
  drawTestResult.m_reason._M_string_length._0_1_ = 0;
  local_2e0->m_passed = true;
  local_2e0->m_notRunForThisContext = false;
  (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
  drawTestResult._0_8_ = psVar10;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2e0->m_reason,psVar10,psVar10);
  if ((size_type *)drawTestResult._0_8_ != psVar10) {
    decl.field_2._M_allocated_capacity =
         CONCAT71(drawTestResult.m_reason._M_string_length._1_7_,
                  (undefined1)drawTestResult.m_reason._M_string_length);
    decl._M_dataplus._M_p = (pointer)drawTestResult._0_8_;
LAB_00bc1bb5:
    operator_delete(decl._M_dataplus._M_p,decl.field_2._M_allocated_capacity + 1);
  }
LAB_00bc1bbd:
  if (bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
  std::ios_base::~ios_base
            ((ios_base *)
             &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  return pLVar9;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_basic_render()
{
	bool passed = true;

	StringStream s;
	s << buildAccess(getDefaultUniformName()) << ";\n";
	setTemplateParam("UNIFORM_ACCESS", s.str());

	std::vector<int> bindings = makeSparseRange(maxBindings());
	for (std::vector<int>::iterator it = bindings.begin(); it < bindings.end(); it++)
	{
		int	binding = *it;
		String decl =
			buildUniformDecl(String(getTestParameters().keyword), buildLayout(binding),
							 String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
							 buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam("UNIFORM_DECL", decl);
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog());
		}

		LayoutBindingTestResult drawTestResult = ((*this).*(m_drawTest))(program->getProgram(), binding);
		if (!drawTestResult.testPassed())
		{
			return LayoutBindingTestResult(drawTestResult.testPassed(), drawTestResult.getReason());
		}
	}
	return true;
}